

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

Circle * EDCircles::addCircle
                   (Circle *circles,int *noCircles,double xc,double yc,double r,
                   double circleFitError,double *x,double *y,int noPixels)

{
  int iVar1;
  
  iVar1 = *noCircles;
  circles[iVar1].xc = xc;
  circles[iVar1].yc = yc;
  circles[iVar1].r = r;
  circles[iVar1].circleFitError = circleFitError;
  circles[iVar1].coverRatio = (double)noPixels / (r * 6.283185307179586);
  circles[iVar1].x = x;
  circles[iVar1].y = y;
  circles[iVar1].noPixels = noPixels;
  iVar1 = *noCircles;
  circles[iVar1].isEllipse = false;
  *noCircles = iVar1 + 1;
  return circles + iVar1;
}

Assistant:

Circle * EDCircles::addCircle(Circle *circles, int &noCircles,double xc, double yc, double r, double circleFitError, double * x, double * y, int noPixels)
{
	circles[noCircles].xc = xc;
	circles[noCircles].yc = yc;
	circles[noCircles].r = r;
	circles[noCircles].circleFitError = circleFitError;
	circles[noCircles].coverRatio = noPixels / (TWOPI*r);

	circles[noCircles].x = x;
	circles[noCircles].y = y;
	circles[noCircles].noPixels = noPixels;

	circles[noCircles].isEllipse = false;

	noCircles++;

	return &circles[noCircles - 1];
}